

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_method_set_home_object(JSContext *ctx,JSValue func_obj,JSValue home_obj)

{
  JSValueUnion JVar1;
  JSRefCountHeader *p;
  JSValueUnion JVar2;
  JSValue v;
  
  JVar1 = home_obj.u;
  JVar2 = func_obj.u;
  if (((((int)func_obj.tag == -1) && ((ulong)*(ushort *)((long)JVar2.ptr + 6) < 0x32)) &&
      ((0x2200000012000U >> ((ulong)*(ushort *)((long)JVar2.ptr + 6) & 0x3f) & 1) != 0)) &&
     ((*(byte *)(*(long *)((long)JVar2.ptr + 0x30) + 0x19) & 8) != 0)) {
    if (((JSValueUnion *)((long)JVar2.ptr + 0x40))->ptr != (void *)0x0) {
      v.tag = -1;
      v.u.ptr = ((JSValueUnion *)((long)JVar2.ptr + 0x40))->ptr;
      JS_FreeValue(ctx,v);
    }
    if ((int)home_obj.tag == -1) {
      *(int *)JVar1.ptr = *JVar1.ptr + 1;
    }
    else {
      JVar1.float64 = 0.0;
    }
    ((JSValueUnion *)((long)JVar2.ptr + 0x40))->ptr = (void *)JVar1;
  }
  return;
}

Assistant:

static void js_method_set_home_object(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst home_obj)
{
    JSObject *p, *p1;
    JSFunctionBytecode *b;

    if (JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT)
        return;
    p = JS_VALUE_GET_OBJ(func_obj);
    if (!js_class_has_bytecode(p->class_id))
        return;
    b = p->u.func.function_bytecode;
    if (b->need_home_object) {
        p1 = p->u.func.home_object;
        if (p1) {
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p1));
        }
        if (JS_VALUE_GET_TAG(home_obj) == JS_TAG_OBJECT)
            p1 = JS_VALUE_GET_OBJ(JS_DupValue(ctx, home_obj));
        else
            p1 = NULL;
        p->u.func.home_object = p1;
    }
}